

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O0

void __thiscall duckdb_parquet::PageHeader::PageHeader(PageHeader *this)

{
  DataPageHeaderV2 *in_RDI;
  
  duckdb_apache::thrift::TBase::TBase((TBase *)in_RDI);
  *(undefined ***)in_RDI = &PTR__PageHeader_03540860;
  *(undefined ***)in_RDI = &PTR__PageHeader_03540860;
  in_RDI->num_values = 0;
  in_RDI->num_nulls = PLAIN;
  in_RDI->num_rows = PLAIN;
  in_RDI->encoding = PLAIN;
  DataPageHeader::DataPageHeader((DataPageHeader *)in_RDI);
  IndexPageHeader::IndexPageHeader((IndexPageHeader *)in_RDI);
  DictionaryPageHeader::DictionaryPageHeader((DictionaryPageHeader *)in_RDI);
  DataPageHeaderV2::DataPageHeaderV2(in_RDI);
  _PageHeader__isset::_PageHeader__isset((_PageHeader__isset *)&in_RDI[2].statistics);
  return;
}

Assistant:

PageHeader::PageHeader() noexcept
   : type(static_cast<PageType::type>(0)),
     uncompressed_page_size(0),
     compressed_page_size(0),
     crc(0) {
}